

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

void benchmark<unsigned_short>(tasks_t tasks,size_t max,size_t iters)

{
  unsigned_short uVar1;
  ostream *poVar2;
  char *pcVar3;
  unsigned_long *puVar4;
  long in_RDX;
  ulong in_RSI;
  uint in_EDI;
  vector<libdivide::divider<unsigned_short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)1>_>_>
  dividers_2;
  vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  dividers_1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> dividers;
  unsigned_short t_max;
  size_t st_max;
  result_t branchfree;
  result_t branchfull;
  result_t sys;
  bool test_branchfree;
  bool test_branchfull;
  bool test_system;
  vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  *in_stack_fffffffffffffea0;
  vector<libdivide::divider<unsigned_short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)1>_>_>
  *this;
  ostream *in_stack_fffffffffffffeb8;
  vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  *in_stack_fffffffffffffec0;
  undefined8 in_stack_ffffffffffffff08;
  unsigned_short max_00;
  undefined8 in_stack_ffffffffffffff10;
  unsigned_short max_01;
  unsigned_short in_stack_ffffffffffffff1e;
  vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
  local_c0;
  result_t local_98;
  undefined2 local_6a;
  ulong local_68;
  ulong local_60;
  result_t local_58;
  result_t local_48;
  result_t local_38;
  byte local_1b;
  byte local_1a;
  byte local_19;
  long local_18;
  ulong local_10;
  uint local_4;
  
  max_01 = (unsigned_short)((ulong)in_stack_ffffffffffffff10 >> 0x30);
  max_00 = (unsigned_short)((ulong)in_stack_ffffffffffffff08 >> 0x30);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"----- ");
  pcVar3 = type_tag<unsigned_short>::get_tag();
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," -----");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_19 = (local_4 & 0x40) != 0;
  local_1a = (local_4 & 0x100) != 0;
  local_1b = (local_4 & 0x80) != 0;
  memset(&local_38,0,0x10);
  memset(&local_48,0,0x10);
  memset(&local_58,0,0x10);
  uVar1 = std::numeric_limits<unsigned_short>::max();
  local_68 = (ulong)uVar1;
  puVar4 = std::min<unsigned_long>(&local_10,&local_68);
  local_60 = *puVar4;
  local_18 = local_18 * (local_10 / local_60);
  local_6a = (undefined2)local_60;
  if ((local_19 & 1) != 0) {
    get_primes<unsigned_short,unsigned_short>(max_00);
    local_98 = benchmark_sum_dividers<unsigned_short,std::vector<unsigned_short,std::allocator<unsigned_short>>>
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
    local_38 = local_98;
    poVar2 = std::operator<<((ostream *)&std::cout,'.');
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffea0)
    ;
  }
  if ((local_1a & 1) != 0) {
    in_stack_fffffffffffffec0 = &local_c0;
    get_primes<libdivide::divider<unsigned_short,(libdivide::Branching)0>,unsigned_short>
              (in_stack_ffffffffffffff1e);
    local_48 = benchmark_sum_dividers<unsigned_short,std::vector<libdivide::divider<unsigned_short,(libdivide::Branching)0>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)0>>>>
                         (in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffeb8 = std::operator<<((ostream *)&std::cout,'.');
    std::ostream::operator<<(in_stack_fffffffffffffeb8,std::flush<char,std::char_traits<char>>);
    std::
    vector<libdivide::divider<unsigned_short,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)0>_>_>
    ::~vector(in_stack_fffffffffffffea0);
  }
  if ((local_1b & 1) != 0) {
    this = (vector<libdivide::divider<unsigned_short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)1>_>_>
            *)&stack0xffffffffffffff18;
    get_primes<libdivide::divider<unsigned_short,(libdivide::Branching)1>,unsigned_short>(max_01);
    local_58 = benchmark_sum_dividers<unsigned_short,std::vector<libdivide::divider<unsigned_short,(libdivide::Branching)1>,std::allocator<libdivide::divider<unsigned_short,(libdivide::Branching)1>>>>
                         ((vector<libdivide::divider<unsigned_short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)1>_>_>
                           *)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
    poVar2 = std::operator<<((ostream *)&std::cout,'.');
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    vector<libdivide::divider<unsigned_short,_(libdivide::Branching)1>,_std::allocator<libdivide::divider<unsigned_short,_(libdivide::Branching)1>_>_>
    ::~vector(this);
  }
  if ((((local_19 & 1) != 0) && ((local_1a & 1) != 0)) && (local_48.sum != local_38.sum)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: branchfull_divider<");
    pcVar3 = type_tag<unsigned_short>::get_tag();
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"> sum: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_48.sum);
    poVar2 = std::operator<<(poVar2,", but system sum: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38.sum);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  if ((((local_19 & 1) != 0) && ((local_1b & 1) != 0)) && (local_58.sum != local_38.sum)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: branchfree_divider<");
    pcVar3 = type_tag<unsigned_short>::get_tag();
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"> sum: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_58.sum);
    poVar2 = std::operator<<(poVar2,", but system sum: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38.sum);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  if ((local_19 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"    system: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38.duration);
    poVar2 = std::operator<<(poVar2," seconds");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((local_1a & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"branchfull: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_48.duration);
    poVar2 = std::operator<<(poVar2," seconds");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((local_1b & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"branchfree: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_58.duration);
    poVar2 = std::operator<<(poVar2," seconds");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void benchmark(tasks_t tasks, size_t max, size_t iters) {
    std::cout << "----- " << type_tag<T>::get_tag() << " -----" << std::endl;

    bool test_system = !!(tasks & TEST_SYSTEM);
    bool test_branchfull = !!(tasks & TEST_BRANCHFULL);
    bool test_branchfree = !!(tasks & TEST_BRANCHFREE);

    result_t sys = {0, 0};
    result_t branchfull = {0, 0};
    result_t branchfree = {0, 0};

    size_t st_max = std::min(max, (size_t)std::numeric_limits<T>::max());
    iters = iters * (max / st_max);
    T t_max = (T)st_max;
    if (test_system) {
        using divider_type = T;
        auto dividers = get_primes<divider_type>(t_max);
        sys = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfull) {
        using divider_type = libdivide::divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfull = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::flush;
    }

    if (test_branchfree) {
        using divider_type = libdivide::branchfree_divider<T>;
        auto dividers = get_primes<divider_type>(t_max);
        branchfree = benchmark_sum_dividers<T>(dividers, iters);
        std::cout << '.' << std::endl;
    }

    if (test_system && test_branchfull && branchfull.sum != sys.sum) {
        std::cerr << "Error: branchfull_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfull.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system && test_branchfree && branchfree.sum != sys.sum) {
        std::cerr << "Error: branchfree_divider<" << type_tag<T>::get_tag() << "> sum: " << branchfree.sum
                  << ", but system sum: " << sys.sum << std::endl;
        std::exit(1);
    }

    if (test_system) std::cout << "    system: " << sys.duration << " seconds" << std::endl;
    if (test_branchfull)
        std::cout << "branchfull: " << branchfull.duration << " seconds" << std::endl;
    if (test_branchfree)
        std::cout << "branchfree: " << branchfree.duration << " seconds" << std::endl;

    std::cout << std::endl;
}